

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debugger.cpp
# Opt level: O2

bool __thiscall
Debugger::CallFunction
          (Debugger *this,char *functionName,JsValueRef *result,JsValueRef arg1,JsValueRef arg2)

{
  code *pcVar1;
  unsigned_short uVar2;
  JsErrorCode JVar3;
  PAL_FILE *pPVar4;
  LPCWSTR pWVar5;
  bool bVar6;
  JsValueRef local_78;
  JsValueRef args [3];
  AutoRestoreContext autoRestoreContext;
  JsValueRef globalObj;
  JsPropertyIdRef targetFuncId;
  JsValueRef targetFunc;
  
  targetFunc = result;
  AutoRestoreContext::AutoRestoreContext((AutoRestoreContext *)(args + 2),this->m_context);
  autoRestoreContext.contextChanged = false;
  autoRestoreContext._9_7_ = 0;
  JVar3 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtGetGlobalObject)
                    ((JsValueRef *)&autoRestoreContext.contextChanged);
  if (JVar3 == JsNoError) {
    globalObj = (JsValueRef)0x0;
    JVar3 = CreatePropertyIdFromString(functionName,&globalObj);
    if (JVar3 == JsNoError) {
      targetFuncId = (JsPropertyIdRef)0x0;
      JVar3 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtGetProperty)
                        ((JsValueRef)autoRestoreContext._8_8_,globalObj,&targetFuncId);
      if (JVar3 == JsNoError) {
        JVar3 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtGetUndefinedValue)(&local_78);
        if (JVar3 == JsNoError) {
          if (arg1 == (JsValueRef)0x0) {
            uVar2 = 1;
            if (arg2 != (JsValueRef)0x0) {
              pPVar4 = PAL_get_stderr(0);
              PAL_fprintf(pPVar4,"ASSERTION (%s, line %d) %s %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/bin/ch/Debugger.cpp"
                          ,0x17a,"arg2 == JS_INVALID_REFERENCE || argCount != 1",
                          "arg2 == JS_INVALID_REFERENCE || argCount != 1");
              pPVar4 = PAL_get_stderr(0);
              PAL_fflush(pPVar4);
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
          }
          else {
            args[0] = arg1;
            if (arg2 == (JsValueRef)0x0) {
              uVar2 = 2;
            }
            else {
              uVar2 = 3;
              args[1] = arg2;
            }
          }
          JVar3 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtCallFunction)
                            (targetFuncId,&local_78,uVar2,(JsValueRef *)targetFunc);
          if (JVar3 == JsNoError) {
            bVar6 = true;
            goto LAB_0010b987;
          }
          pPVar4 = PAL_get_stderr(0);
          pWVar5 = Helpers::JsErrorCodeToString(JVar3);
          PAL_fwprintf(pPVar4,
                       L"ERROR: ChakraRTInterface::JsCallFunction(targetFunc, args, argCount, result) failed. JsErrorCode=0x%x (%s)\n"
                       ,(ulong)JVar3,pWVar5);
          pPVar4 = PAL_get_stderr(0);
          PAL_fflush(pPVar4);
        }
        else {
          pPVar4 = PAL_get_stderr(0);
          pWVar5 = Helpers::JsErrorCodeToString(JVar3);
          PAL_fwprintf(pPVar4,
                       L"ERROR: ChakraRTInterface::JsGetUndefinedValue(&args[0]) failed. JsErrorCode=0x%x (%s)\n"
                       ,(ulong)JVar3,pWVar5);
          pPVar4 = PAL_get_stderr(0);
          PAL_fflush(pPVar4);
        }
      }
      else {
        pPVar4 = PAL_get_stderr(0);
        pWVar5 = Helpers::JsErrorCodeToString(JVar3);
        PAL_fwprintf(pPVar4,
                     L"ERROR: ChakraRTInterface::JsGetProperty(globalObj, targetFuncId, &targetFunc) failed. JsErrorCode=0x%x (%s)\n"
                     ,(ulong)JVar3,pWVar5);
        pPVar4 = PAL_get_stderr(0);
        PAL_fflush(pPVar4);
      }
    }
    else {
      pPVar4 = PAL_get_stderr(0);
      pWVar5 = Helpers::JsErrorCodeToString(JVar3);
      PAL_fwprintf(pPVar4,
                   L"ERROR: CreatePropertyIdFromString(functionName, &targetFuncId) failed. JsErrorCode=0x%x (%s)\n"
                   ,(ulong)JVar3,pWVar5);
      pPVar4 = PAL_get_stderr(0);
      PAL_fflush(pPVar4);
    }
  }
  else {
    pPVar4 = PAL_get_stderr(0);
    pWVar5 = Helpers::JsErrorCodeToString(JVar3);
    PAL_fwprintf(pPVar4,
                 L"ERROR: ChakraRTInterface::JsGetGlobalObject(&globalObj) failed. JsErrorCode=0x%x (%s)\n"
                 ,(ulong)JVar3,pWVar5);
    pPVar4 = PAL_get_stderr(0);
    PAL_fflush(pPVar4);
  }
  bVar6 = false;
LAB_0010b987:
  AutoRestoreContext::~AutoRestoreContext((AutoRestoreContext *)(args + 2));
  return bVar6;
}

Assistant:

bool Debugger::CallFunction(char const * functionName, JsValueRef *result, JsValueRef arg1, JsValueRef arg2)
{
    AutoRestoreContext autoRestoreContext(this->m_context);

    // Get the global object
    JsValueRef globalObj = JS_INVALID_REFERENCE;
    IfJsrtErrorFailLogAndRetFalse(ChakraRTInterface::JsGetGlobalObject(&globalObj));

    // Get a script string for the function name
    JsPropertyIdRef targetFuncId = JS_INVALID_REFERENCE;
    IfJsrtErrorFailLogAndRetFalse(CreatePropertyIdFromString(functionName, &targetFuncId));

    // Get the target function
    JsValueRef targetFunc = JS_INVALID_REFERENCE;
    IfJsrtErrorFailLogAndRetFalse(ChakraRTInterface::JsGetProperty(globalObj, targetFuncId, &targetFunc));

    static const unsigned short MaxArgs = 2;
    JsValueRef args[MaxArgs + 1];

    // Pass in undefined for 'this'
    IfJsrtErrorFailLogAndRetFalse(ChakraRTInterface::JsGetUndefinedValue(&args[0]));

    unsigned short argCount = 1;

    if (arg1 != JS_INVALID_REFERENCE)
    {
        args[argCount++] = arg1;
    }

    Assert(arg2 == JS_INVALID_REFERENCE || argCount != 1);

    if (arg2 != JS_INVALID_REFERENCE)
    {
        args[argCount++] = arg2;
    }

    // Call the function
    IfJsrtErrorFailLogAndRetFalse(ChakraRTInterface::JsCallFunction(targetFunc, args, argCount, result));

    return true;
}